

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_create_vspace(nvrm_ioctl_create_vspace *s)

{
  uint uVar1;
  uint32_t status;
  uint64_t uVar2;
  FILE *__stream;
  int iVar3;
  char *pcVar4;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("cid");
    if (iVar3 != 0) goto LAB_00255851;
  }
  else {
LAB_00255851:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("handle");
    if (iVar3 != 0) goto LAB_00255897;
  }
  else {
LAB_00255897:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
    pcVar4 = nvrm_pfx;
  }
  fprintf(_stdout,"%sclass: 0x%04x",pcVar4,(ulong)s->cls);
  pcVar4 = nvrm_get_class_name(s->cls);
  if (pcVar4 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar4);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->parent;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("parent");
    if (iVar3 != 0) goto LAB_00255940;
  }
  else {
LAB_00255940:
    fprintf(_stdout,"%sparent: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  uVar1 = s->flags;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("flags");
    if (iVar3 != 0) goto LAB_0025598d;
  }
  else {
LAB_0025598d:
    fprintf(_stdout,"%sflags: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad1 != 0) {
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad1,colors->reset);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar2 = s->foffset;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("foffset");
    if (iVar3 != 0) goto LAB_00255a0c;
  }
  else {
LAB_00255a0c:
    fprintf(_stdout,"%sfoffset: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  uVar2 = s->limit;
  nvrm_pfx = pcVar4;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("limit");
    if (iVar3 != 0) goto LAB_00255a4b;
  }
  else {
LAB_00255a4b:
    fprintf(_stdout,"%slimit: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  status = s->status;
  nvrm_pfx = pcVar4;
  if (status == 0) {
    iVar3 = _nvrm_field_enabled("status");
    if (iVar3 == 0) goto LAB_00255ab5;
  }
  __stream = _stdout;
  nvrm_status(status);
  fprintf(__stream,"%sstatus: %s",pcVar4,nvrm_status::buf);
  pcVar4 = nvrm_sep;
LAB_00255ab5:
  nvrm_pfx = pcVar4;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",pcVar4,colors->err,(ulong)s->_pad2,colors->reset);
    nvrm_pfx = nvrm_sep;
  }
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_vspace(struct nvrm_ioctl_create_vspace *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_x64(s, foffset);
	nvrm_print_x64(s, limit);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}